

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O3

void __thiscall
upb::generator::Plugin::AddOutputFile(Plugin *this,string_view filename,string_view content)

{
  google_protobuf_compiler_CodeGeneratorResponse_File *pgVar1;
  upb_StringView uVar2;
  
  pgVar1 = google_protobuf_compiler_CodeGeneratorResponse_add_file
                     (this->response_,
                      (this->arena_).ptr_._M_t.
                      super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                      super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                      super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl);
  uVar2 = StringDup(this,filename);
  if (((ulong)(pgVar1->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
    *(byte *)&pgVar1[1].base_dont_copy_me__upb_internal_use_only.field_0 =
         *(byte *)&pgVar1[1].base_dont_copy_me__upb_internal_use_only.field_0 | 1;
    *(upb_StringView *)(pgVar1 + 2) = uVar2;
    uVar2 = StringDup(this,content);
    if (((ulong)(pgVar1->base_dont_copy_me__upb_internal_use_only).field_0 & 1) == 0) {
      *(byte *)&pgVar1[1].base_dont_copy_me__upb_internal_use_only.field_0 =
           *(byte *)&pgVar1[1].base_dont_copy_me__upb_internal_use_only.field_0 | 4;
      *(upb_StringView *)(pgVar1 + 6) = uVar2;
      return;
    }
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/message/internal/accessors.h"
                ,0x13b,
                "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
               );
}

Assistant:

void AddOutputFile(absl::string_view filename, absl::string_view content) {
    UPB_DESC(compiler_CodeGeneratorResponse_File)* file = UPB_DESC(
        compiler_CodeGeneratorResponse_add_file)(response_, arena_.ptr());
    UPB_DESC(compiler_CodeGeneratorResponse_File_set_name)
    (file, StringDup(filename));
    UPB_DESC(compiler_CodeGeneratorResponse_File_set_content)
    (file, StringDup(content));
  }